

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O3

string * OpenMesh::IO::get_property_name
                   (string *__return_storage_ptr__,string *_string1,string *_string2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  
  iVar4 = std::__cxx11::string::compare((char *)_string1);
  if ((((((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0)) &&
        (iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0)) &&
       (((iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0 &&
         (iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0)) &&
        ((iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0 &&
         ((iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0 &&
          (iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0)))))))) &&
      ((iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0 &&
       (((iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0 &&
         (iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0)) &&
        (iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0)))))) &&
     (((iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0 &&
       (iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0)) &&
      ((iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0 &&
       (iVar4 = std::__cxx11::string::compare((char *)_string1), iVar4 != 0)))))) {
    iVar4 = std::__cxx11::string::compare((char *)_string2);
    if ((((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0)) &&
        (iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0)) &&
       (((((iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0 &&
           (iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0)) &&
          (iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0)) &&
         ((iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0 &&
          (iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0)))) &&
        ((((iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0 &&
           ((iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0 &&
            (iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0)))) &&
          (iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0)) &&
         ((((iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0 &&
            (iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0)) &&
           (iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0)) &&
          (iVar4 = std::__cxx11::string::compare((char *)_string2), iVar4 != 0)))))))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unsupported entry type",0x16);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"Unsupported","");
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (_string1->_M_dataplus)._M_p;
    paVar1 = &_string1->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&_string1->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = _string1->_M_string_length;
    (_string1->_M_dataplus)._M_p = (pointer)paVar1;
    _string1->_M_string_length = 0;
    (_string1->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (_string2->_M_dataplus)._M_p;
  paVar1 = &_string2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&_string2->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = _string2->_M_string_length;
  (_string2->_M_dataplus)._M_p = (pointer)paVar1;
  _string2->_M_string_length = 0;
  (_string2->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string get_property_name(std::string _string1, std::string _string2) {

    if (_string1 == "float32" || _string1 == "float64" || _string1 == "float" || _string1 == "double" ||
        _string1 == "int8" || _string1 == "uint8" || _string1 == "char" || _string1 == "uchar" ||
        _string1 == "int32" || _string1 == "uint32" || _string1 == "int" || _string1 == "uint" ||
        _string1 == "int16" || _string1 == "uint16" || _string1 == "short" || _string1 == "ushort")
        return _string2;

    if (_string2 == "float32" || _string2 == "float64" || _string2 == "float" || _string2 == "double" ||
        _string2 == "int8" || _string2 == "uint8" || _string2 == "char" || _string2 == "uchar" ||
        _string2 == "int32" || _string2 == "uint32" || _string2 == "int" || _string2 == "uint" ||
        _string2 == "int16" || _string2 == "uint16" || _string2 == "short" || _string2 == "ushort")
        return _string1;


    std::cerr << "Unsupported entry type" << std::endl;
    return "Unsupported";
}